

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

VerifyPsbtSignRequestStruct * __thiscall
cfd::js::api::json::VerifyPsbtSignRequest::ConvertToStruct
          (VerifyPsbtSignRequestStruct *__return_storage_ptr__,VerifyPsbtSignRequest *this)

{
  vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_> local_30;
  
  VerifyPsbtSignRequestStruct::VerifyPsbtSignRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  core::JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct>::
  ConvertToStruct(&local_30,&this->out_point_list_);
  std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::
  _M_move_assign(&__return_storage_ptr__->out_point_list,&local_30);
  std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::~vector
            (&local_30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

VerifyPsbtSignRequestStruct VerifyPsbtSignRequest::ConvertToStruct() const {  // NOLINT
  VerifyPsbtSignRequestStruct result;
  result.psbt = psbt_;
  result.out_point_list = out_point_list_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}